

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_server_test.cc
# Opt level: O0

void __thiscall
xLearn::KVStoreTest_FeatMap_Test::~KVStoreTest_FeatMap_Test(KVStoreTest_FeatMap_Test *this)

{
  void *in_RDI;
  
  ~KVStoreTest_FeatMap_Test((KVStoreTest_FeatMap_Test *)0x139a48);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(KVStoreTest, FeatMap) {
  KVStore store;
  store.Initialize(3);
  EXPECT_EQ(store.FeatMap((index_t)0), (index_t)0);
  EXPECT_EQ(store.FeatMap((index_t)1), (index_t)0);
  EXPECT_EQ(store.FeatMap((index_t)2), (index_t)0);
  EXPECT_EQ(store.FeatMap((index_t)3), (index_t)1);
  EXPECT_EQ(store.FeatMap((index_t)4), (index_t)1);
  EXPECT_EQ(store.FeatMap((index_t)5), (index_t)1);
  EXPECT_EQ(store.FeatMap((index_t)6), (index_t)2);
  EXPECT_EQ(store.FeatMap((index_t)7), (index_t)2);
  EXPECT_EQ(store.FeatMap((index_t)8), (index_t)2);
  EXPECT_EQ(store.FeatMap((index_t)9), (index_t)3);
}